

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint32_t helper_neon_narrow_sat_u8_aarch64(CPUARMState_conflict *env,uint64_t x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if ((x & 0xff00) == 0) {
    uVar2 = (uint)x & 0xff;
  }
  else {
    (env->vfp).qc[0] = 1;
    uVar2 = 0xff;
  }
  if ((char)(x >> 0x18) == '\0') {
    uVar1 = (uint)(x >> 8) & 0xff00;
  }
  else {
    (env->vfp).qc[0] = 1;
    uVar1 = 0xff00;
  }
  if ((char)(x >> 0x28) == '\0') {
    uVar4 = (uint)(x >> 0x10) & 0xff0000;
  }
  else {
    (env->vfp).qc[0] = 1;
    uVar4 = 0xff0000;
  }
  if (x >> 0x38 == 0) {
    uVar3 = (uint)(x >> 0x18) & 0xff000000;
  }
  else {
    (env->vfp).qc[0] = 1;
    uVar3 = 0xff000000;
  }
  return uVar1 | uVar2 | uVar4 | uVar3;
}

Assistant:

uint32_t HELPER(neon_narrow_sat_u8)(CPUARMState *env, uint64_t x)
{
    uint16_t s;
    uint8_t d;
    uint32_t res = 0;
#define SAT8(n) \
    s = x >> n; \
    if (s > 0xff) { \
        d = 0xff; \
        SET_QC(); \
    } else  { \
        d = s; \
    } \
    res |= (uint32_t)d << (n / 2);

    SAT8(0);
    SAT8(16);
    SAT8(32);
    SAT8(48);
#undef SAT8
    return res;
}